

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

void __thiscall QDateTime::setMSecsSinceEpoch(QDateTime *this,qint64 msecs)

{
  bool bVar1;
  enable_if_t<std::is_signed_v<long_long>,_bool> eVar2;
  TimeSpec spec_00;
  StatusFlags SVar3;
  int iVar4;
  Int IVar5;
  QFlags<QDateTimePrivate::StatusFlag> QVar6;
  QTimeZonePrivate *pQVar7;
  QDateTimePrivate *pQVar8;
  qint64 in_RSI;
  Data *in_RDI;
  long in_FS_OFFSET;
  TimeSpec spec;
  StatusFlags status;
  Data data;
  ZoneState state;
  QFlagsStorage<QDateTimePrivate::StatusFlag> in_stack_fffffffffffffefc;
  QDateTimeData *in_stack_ffffffffffffff00;
  Data DVar9;
  QFlagsStorage<QDateTimePrivate::StatusFlag> in_stack_ffffffffffffff08;
  int iVar10;
  undefined4 in_stack_ffffffffffffff0c;
  Data *in_stack_ffffffffffffff20;
  QFlagsStorage<QDateTimePrivate::StatusFlag> local_6c;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  Data local_38;
  undefined1 *local_30;
  byte local_28;
  Data local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_6c.i = 0xaaaaaaaa;
  local_6c.i = (Int)getStatus(in_stack_ffffffffffffff00);
  spec_00 = extractSpec((StatusFlags)in_stack_fffffffffffffefc.i);
  local_20.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDateTimePrivate::ZoneState::ZoneState((ZoneState *)&local_20.data,in_RSI);
  SVar3 = ::operator~((enum_type)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  QFlags<QDateTimePrivate::StatusFlag>::operator&=
            ((QFlags<QDateTimePrivate::StatusFlag> *)&local_6c,
             (QFlags<QDateTimePrivate::StatusFlag>)
             SVar3.super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
             super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i);
  bVar1 = QTimeZone::isUtcOrFixedOffset(spec_00);
  if (bVar1) {
    if (spec_00 == OffsetFromUTC) {
      pQVar8 = Data::operator->(in_RDI);
      local_18 = (undefined1 *)CONCAT44(local_18._4_4_,pQVar8->m_offsetFromUtc);
    }
    if (((int)local_18 == 0) ||
       (eVar2 = qAddOverflow<long_long>(in_RSI,(long)(int)local_18 * 1000,(longlong *)&local_20),
       !eVar2)) {
      QFlags<QDateTimePrivate::StatusFlag>::operator|=
                ((QFlags<QDateTimePrivate::StatusFlag> *)&local_6c,ValidityMask);
    }
  }
  else if (spec_00 == LocalTime) {
    QDateTimePrivate::expressUtcAsLocal(in_RSI);
    local_20 = local_38;
    local_18 = local_30;
    local_10 = (undefined1 *)CONCAT71(local_10._1_7_,local_28);
    if ((local_28 & 1) != 0) {
      QFlags<QDateTimePrivate::StatusFlag>::operator|
                ((QFlags<QDateTimePrivate::StatusFlag> *)&in_stack_ffffffffffffff00->data,
                 in_stack_fffffffffffffefc.i);
      local_6c.i = (Int)mergeDaylightStatus(in_stack_ffffffffffffff08.i,
                                            (DaylightStatus)
                                            ((ulong)in_stack_ffffffffffffff00 >> 0x20));
    }
  }
  else if (spec_00 == TimeZone) {
    Data::detach(in_stack_ffffffffffffff20);
    Data::operator->(in_RDI);
    bVar1 = QTimeZone::isValid((QTimeZone *)
                               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08.i));
    if (bVar1) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar8 = Data::operator->(in_RDI);
      pQVar7 = QTimeZone::Data::operator->((Data *)&pQVar8->m_timeZone);
      (*pQVar7->_vptr_QTimeZonePrivate[0xd])(&local_68,pQVar7,in_RSI);
      iVar10 = (int)local_48;
      iVar4 = QTimeZonePrivate::invalidSeconds();
      if (iVar10 == iVar4) {
LAB_0056fef4:
        bVar1 = false;
      }
      else {
        local_18 = (undefined1 *)CONCAT44(local_18._4_4_,(int)local_48);
        if (((int)local_48 != 0) &&
           (eVar2 = qAddOverflow<long_long>(in_RSI,(long)(int)local_48 * 1000,(longlong *)&local_20)
           , eVar2)) goto LAB_0056fef4;
        QFlags<QDateTimePrivate::StatusFlag>::operator|
                  ((QFlags<QDateTimePrivate::StatusFlag> *)&in_stack_ffffffffffffff00->data,
                   in_stack_fffffffffffffefc.i);
        SVar3 = mergeDaylightStatus((StatusFlags)in_stack_ffffffffffffff08.i,
                                    (DaylightStatus)((ulong)in_stack_ffffffffffffff00 >> 0x20));
        pQVar8 = Data::operator->(in_RDI);
        DVar9 = local_20;
        (pQVar8->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
        super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i =
             (Int)SVar3.super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                  super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
        in_stack_ffffffffffffff20 = (Data *)Data::operator->(in_RDI);
        in_stack_ffffffffffffff20[1] = DVar9;
        iVar10 = (int)local_18;
        pQVar8 = Data::operator->(in_RDI);
        pQVar8->m_offsetFromUtc = iVar10;
        bVar1 = true;
      }
      QTimeZonePrivate::Data::~Data((Data *)0x56ff09);
      if (bVar1) goto LAB_00570023;
    }
  }
  bVar1 = msecsCanBeSmall((qint64)in_stack_ffffffffffffff00);
  if ((bVar1) && (bVar1 = Data::isShort(in_RDI), bVar1)) {
    *(ulong *)in_RDI = *(ulong *)in_RDI & 0xff | (long)local_20.d << 8;
    IVar5 = QFlags<QDateTimePrivate::StatusFlag>::toInt
                      ((QFlags<QDateTimePrivate::StatusFlag> *)&local_6c);
    *(ulong *)in_RDI = *(ulong *)in_RDI & 0xffffffffffffff00 | (ulong)IVar5 & 0xff;
  }
  else {
    Data::detach(in_stack_ffffffffffffff20);
    ::operator~((enum_type)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    QVar6 = QFlags<QDateTimePrivate::StatusFlag>::operator&
                      ((QFlags<QDateTimePrivate::StatusFlag> *)&in_stack_ffffffffffffff00->data,
                       (QFlags<QDateTimePrivate::StatusFlag>)in_stack_ffffffffffffff08.i);
    pQVar8 = Data::operator->(in_RDI);
    (pQVar8->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i =
         (Int)QVar6.super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
              super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    DVar9 = local_20;
    pQVar8 = Data::operator->(in_RDI);
    pQVar8->m_msecs = (qint64)DVar9;
    iVar10 = (int)local_18;
    pQVar8 = Data::operator->(in_RDI);
    pQVar8->m_offsetFromUtc = iVar10;
  }
LAB_00570023:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTime::setMSecsSinceEpoch(qint64 msecs)
{
    auto status = getStatus(d);
    const auto spec = extractSpec(status);
    Q_ASSERT(specCanBeSmall(spec) || !d.isShort());
    QDateTimePrivate::ZoneState state(msecs);

    status &= ~QDateTimePrivate::ValidityMask;
    if (QTimeZone::isUtcOrFixedOffset(spec)) {
        if (spec == Qt::OffsetFromUTC)
            state.offset = d->m_offsetFromUtc;
        if (!state.offset || !qAddOverflow(msecs, state.offset * MSECS_PER_SEC, &state.when))
            status |= QDateTimePrivate::ValidityMask;
    } else if (spec == Qt::LocalTime) {
        state = QDateTimePrivate::expressUtcAsLocal(msecs);
        if (state.valid)
            status = mergeDaylightStatus(status | QDateTimePrivate::ValidityMask, state.dst);
#if QT_CONFIG(timezone)
    } else if (spec == Qt::TimeZone && (d.detach(), d->m_timeZone.isValid())) {
        const auto data = d->m_timeZone.d->data(msecs);
        if (Q_LIKELY(data.offsetFromUtc != QTimeZonePrivate::invalidSeconds())) {
            state.offset = data.offsetFromUtc;
            Q_ASSERT(state.offset >= -SECS_PER_DAY && state.offset <= SECS_PER_DAY);
            if (!state.offset
                || !Q_UNLIKELY(qAddOverflow(msecs, state.offset * MSECS_PER_SEC, &state.when))) {
                d->m_status = mergeDaylightStatus(status | QDateTimePrivate::ValidityMask,
                                                  data.daylightTimeOffset
                                                  ? QDateTimePrivate::DaylightTime
                                                  : QDateTimePrivate::StandardTime);
                d->m_msecs = state.when;
                d->m_offsetFromUtc = state.offset;
                return;
            } // else: zone can't represent this UTC time
        } // else: zone unable to represent given UTC time (should only happen on overflow).
#endif // timezone
    }
    Q_ASSERT(!status.testFlag(QDateTimePrivate::ValidDateTime)
             || (state.offset >= -SECS_PER_DAY && state.offset <= SECS_PER_DAY));

    if (msecsCanBeSmall(state.when) && d.isShort()) {
        // we can keep short
        d.data.msecs = qintptr(state.when);
        d.data.status = status.toInt();
    } else {
        d.detach();
        d->m_status = status & ~QDateTimePrivate::ShortData;
        d->m_msecs = state.when;
        d->m_offsetFromUtc = state.offset;
    }
}